

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<float_const&>(QtPromise *this,float *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<float>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  float *local_18;
  float *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (float *)this;
  QPromise<float>::
  QPromise<QtPromise::resolve<float_const&>(float_const&)::_lambda(QtPromise::QPromiseResolve<float>&&,QtPromise::QPromiseReject<float>&&)_1_>
            ((QPromise<float> *)this,&local_20);
  TVar1.super_QPromiseBase<float>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<float>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<float>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}